

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

SIMDType simd::actualSimdType(void)

{
  undefined4 local_4;
  
  if ((isAvxAvailable) && ((isAvxEnabled & 1) != 0)) {
    local_4 = avx_function;
  }
  else if ((isSseAvailable) && ((isSseEnabled & 1) != 0)) {
    local_4 = sse_function;
  }
  else {
    local_4 = cpu_function;
  }
  return local_4;
}

Assistant:

SIMDType actualSimdType()
    {
        #ifdef PENGUINV_AVX_SET
        if ( isAvxAvailable && isAvxEnabled )
            return avx_function;
        #endif

        #ifdef PENGUINV_SSE_SET
        if ( isSseAvailable && isSseEnabled )
            return sse_function;
        #endif

        #ifdef PENGUINV_NEON_SET
        if ( isNeonAvailable && isNeonEnabled )
            return neon_function;
        #endif

        return cpu_function;
    }